

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O1

void __thiscall
cfdcapi_common_CfdGetLastErrorMessage_Test::TestBody
          (cfdcapi_common_CfdGetLastErrorMessage_Test *this)

{
  AssertHelper AVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  char *str_buffer;
  int ret;
  void *handle;
  AssertionResult gtest_ar;
  AssertHelper local_88;
  string local_80;
  AssertHelper local_60;
  int local_54;
  AssertHelper local_50;
  undefined1 local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [32];
  AssertHelper local_18;
  
  local_54 = CfdGetLastErrorMessage((void *)0x0,(char **)0x0);
  local_80._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdIllegalArgumentError","ret",(CfdErrorCode *)&local_80,
             &local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.data_ = (AssertHelperData *)0x0;
  local_54 = CfdGetLastErrorMessage((void *)0x0,(char **)&local_60);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CfdFreeStringBuffer((char *)local_60.data_);
  local_60.data_ = (AssertHelperData *)0x0;
  local_50.data_ = (AssertHelperData *)0x0;
  local_54 = CfdCreateHandle(&local_50.data_);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._M_dataplus._M_p._0_1_ = local_50.data_ != (AssertHelperData *)0x0;
  local_80._M_string_length = 0;
  if (local_50.data_ == (AssertHelperData *)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_80,(AssertionResult *)"(NULL == handle)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8b,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((undefined1 *)CONCAT71(local_48._1_7_,local_48[0]) != local_38) {
      operator_delete((undefined1 *)CONCAT71(local_48._1_7_,local_48[0]));
    }
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
      local_88.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_54 = CfdGetLastErrorMessage(local_50.data_,(char **)&local_60);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_48,"\"\"","str_buffer","",(char *)local_60.data_);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CfdFreeStringBuffer((char *)local_60.data_);
  local_60.data_ = (AssertHelperData *)0x0;
  cfd::capi::SetLastFatalError(local_50.data_,"dummy");
  local_54 = CfdGetLastErrorMessage(local_50.data_,(char **)&local_60);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_48,"\"dummy\"","str_buffer","dummy",(char *)local_60.data_);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CfdFreeStringBuffer((char *)local_60.data_);
  AVar1.data_ = local_50.data_;
  local_60.data_ = (AssertHelperData *)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"dummy_cfdexcept","");
  cfd::core::CfdException::CfdException((CfdException *)local_48,kCfdInternalError,&local_80);
  cfd::capi::SetLastError(AVar1.data_,(CfdException *)local_48);
  cfd::core::CfdException::~CfdException((CfdException *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_54 = CfdGetLastErrorMessage(local_50.data_,(char **)&local_60);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_54 = CfdGetLastErrorCode(local_50.data_);
  local_80._M_dataplus._M_p._0_4_ = 0xfffffffe;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdInternalError","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_48,"\"dummy_cfdexcept\"","str_buffer","dummy_cfdexcept",
             (char *)local_60.data_);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CfdFreeStringBuffer((char *)local_60.data_);
  AVar1.data_ = local_50.data_;
  local_60.data_ = (AssertHelperData *)0x0;
  std::runtime_error::runtime_error((runtime_error *)local_48,"dummy_except");
  cfd::capi::SetLastFatalError(AVar1.data_,(exception *)local_48);
  std::runtime_error::~runtime_error((runtime_error *)local_48);
  local_54 = CfdGetLastErrorMessage(local_50.data_,(char **)&local_60);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_54 = CfdGetLastErrorCode(local_50.data_);
  local_80._M_dataplus._M_p._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdUnknownError","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_48,"\"dummy_except\"","str_buffer","dummy_except",
             (char *)local_60.data_);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CfdFreeStringBuffer((char *)local_60.data_);
  local_60.data_ = (AssertHelperData *)0x0;
  local_54 = CfdFreeHandle(local_50.data_);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_54);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdGetLastErrorMessage) {
  int ret = CfdGetLastErrorMessage(NULL, NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  char* str_buffer = NULL;
  ret = CfdGetLastErrorMessage(NULL, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  void* handle = NULL;
  ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_STREQ("", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastFatalError(handle, "dummy");
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_STREQ("dummy", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastError(handle,
    cfd::core::CfdException(cfd::core::CfdError::kCfdInternalError,
      "dummy_cfdexcept"));
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdInternalError, ret);
  EXPECT_STREQ("dummy_cfdexcept", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastFatalError(handle, std::runtime_error("dummy_except"));
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdUnknownError, ret);
  EXPECT_STREQ("dummy_except", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}